

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

string * relive::heuristicUtf8(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  string *result;
  size_type sVar4;
  
  bVar3 = ghc::filesystem::detail::validUtf8(str);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar3) {
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    sVar2 = str->_M_string_length;
    if (sVar2 != 0) {
      pcVar1 = (str->_M_dataplus)._M_p;
      sVar4 = 0;
      do {
        ghc::filesystem::detail::appendUTF8(__return_storage_ptr__,(uint)(byte)pcVar1[sVar4]);
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string heuristicUtf8(const std::string& str)
{
    if(fs::detail::validUtf8(str)) {
        return str;
    }
    else {
        std::string result;
        result.reserve(str.size());
        for(char c : str) {
            fs::detail::appendUTF8(result, static_cast<uint8_t>(c));
        }
        return result;
    }
}